

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

char32_t * __thiscall
cs::mapping<char32_t,_char32_t>::match(mapping<char32_t,_char32_t> *this,char32_t *k)

{
  bool bVar1;
  mapped_type *pmVar2;
  compile_error *this_00;
  allocator local_31;
  string local_30;
  
  bVar1 = exist(this,k);
  if (bVar1) {
    pmVar2 = std::
             map<char32_t,_char32_t,_std::less<char32_t>,_std::allocator<std::pair<const_char32_t,_char32_t>_>_>
             ::at(&this->mDat,k);
    return pmVar2;
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"Undefined Mapping.",&local_31);
  compile_error::compile_error(this_00,&local_30);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

const T &match(const Key &k) const
		{
			if (!exist(k))
				throw compile_error("Undefined Mapping.");
			return mDat.at(k);
		}